

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::intersection<false>
               (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                *intersection,Dictionary_const_it *begin1,Dictionary_const_it *end1,
               Dictionary_const_it *begin2,Dictionary_const_it *end2,Filtration_value *filtration_)

{
  double dVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar2;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar3;
  Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_48;
  
  if ((begin1->m_ptr != end1->m_ptr) && (begin2->m_ptr != end2->m_ptr)) {
    do {
      while( true ) {
        ppVar2 = begin1->m_ptr;
        ppVar3 = begin2->m_ptr;
        if (ppVar2->first != ppVar3->first) break;
        local_48.super_Filtration_simplex_base.filt_ =
             (ppVar2->second).super_Filtration_simplex_base.filt_;
        dVar1 = (ppVar3->second).super_Filtration_simplex_base.filt_;
        if (local_48.super_Filtration_simplex_base.filt_ < dVar1) {
          local_48.super_Filtration_simplex_base.filt_ = dVar1;
        }
        if (local_48.super_Filtration_simplex_base.filt_ < *filtration_) {
          local_48.super_Filtration_simplex_base.filt_ = *filtration_;
        }
        local_48.super_Key_simplex_base.key_ = 0xffffffff;
        local_48.children_ = (Siblings *)0x0;
        std::
        vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
        ::
        emplace_back<int_const&,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
                  ((vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                    *)intersection,&ppVar2->first,&local_48);
        if (begin1->m_ptr ==
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
             *)0x0) {
LAB_00117620:
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                        "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, true>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, IsConst = true]"
                       );
        }
        ppVar2 = begin1->m_ptr + 1;
        begin1->m_ptr = ppVar2;
        if (ppVar2 == end1->m_ptr) {
          return;
        }
        ppVar3 = begin2->m_ptr;
        if (ppVar3 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                       *)0x0) goto LAB_00117620;
LAB_00117601:
        begin2->m_ptr = ppVar3 + 1;
        if (ppVar3 + 1 == end2->m_ptr) {
          return;
        }
      }
      if (ppVar3->first <= ppVar2->first) goto LAB_00117601;
      begin1->m_ptr = ppVar2 + 1;
    } while (ppVar2 + 1 != end1->m_ptr);
  }
  return;
}

Assistant:

Filtration_simplex_base_dummy(Filtration_value GUDHI_CHECK_code(f)) {
      GUDHI_CHECK(f == null_, "filtration value specified in the constructor for a complex that does not store them");
    }